

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O2

int mbedtls_asn1_get_mpi(uchar **p,uchar *end,mbedtls_mpi *X)

{
  int iVar1;
  size_t len;
  
  iVar1 = mbedtls_asn1_get_tag(p,end,&len,2);
  if (iVar1 == 0) {
    iVar1 = mbedtls_mpi_read_binary(X,*p,len);
    *p = *p + len;
  }
  return iVar1;
}

Assistant:

int mbedtls_asn1_get_mpi( unsigned char **p,
                  const unsigned char *end,
                  mbedtls_mpi *X )
{
    int ret;
    size_t len;

    if( ( ret = mbedtls_asn1_get_tag( p, end, &len, MBEDTLS_ASN1_INTEGER ) ) != 0 )
        return( ret );

    ret = mbedtls_mpi_read_binary( X, *p, len );

    *p += len;

    return( ret );
}